

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  bool bVar5;
  uint32 uVar6;
  UnknownFieldSet *pUVar7;
  UninterpretedOption *value_00;
  string *psVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  bool *value_01;
  int value;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_78;
  bool *local_70;
  bool *local_68;
  bool *local_60;
  bool *local_58;
  bool *local_50;
  bool *local_48;
  bool *local_40;
  bool *local_38;
  
  local_78 = &this->uninterpreted_option_;
  local_38 = &this->cc_enable_arenas_;
  local_40 = &this->java_string_check_utf8_;
  local_48 = &this->deprecated_;
  local_50 = &this->java_generate_equals_and_hash_;
  local_58 = &this->py_generic_services_;
  local_60 = &this->java_generic_services_;
  local_68 = &this->cc_generic_services_;
  local_70 = &this->java_multiple_files_;
LAB_002ff27c:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_002ff685;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_002ff685:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_002ff333_caseD_2;
    uVar4 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar4) {
    case 1:
      if (cVar9 == '\n') {
        psVar8 = mutable_java_package_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->java_package_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.java_package");
        goto LAB_002ff27c;
      }
      break;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x26:
      break;
    case 8:
      if (cVar9 == 'B') {
        psVar8 = mutable_java_outer_classname_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->java_outer_classname_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.java_outer_classname");
        goto LAB_002ff27c;
      }
      break;
    case 9:
      if (cVar9 == 'H') {
        bVar5 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar5) {
          return false;
        }
        if (value - 1U < 3) {
          set_optimize_for(this,value);
        }
        else {
          pUVar7 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar7,9,(long)value);
        }
        goto LAB_002ff27c;
      }
      break;
    case 10:
      if (cVar9 != 'P') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      value_01 = local_70;
LAB_002ff61b:
      bVar5 = internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,value_01);
      goto LAB_002ff620;
    case 0xb:
      if (cVar9 == 'Z') {
        psVar8 = mutable_go_package_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->go_package_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.go_package");
        goto LAB_002ff27c;
      }
      break;
    case 0x10:
      break;
    case 0x11:
      if (cVar9 == -0x78) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 8;
        value_01 = local_60;
        goto LAB_002ff61b;
      }
      break;
    case 0x12:
      if (cVar9 == -0x70) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        value_01 = local_58;
        goto LAB_002ff61b;
      }
      break;
    case 0x14:
      if (cVar9 == -0x60) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 1;
        value_01 = local_50;
        goto LAB_002ff61b;
      }
      break;
    case 0x17:
      if (cVar9 == -0x48) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x20;
        value_01 = local_48;
        goto LAB_002ff61b;
      }
      break;
    case 0x1b:
      if (cVar9 == -0x28) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 2;
        value_01 = local_40;
        goto LAB_002ff61b;
      }
      break;
    case 0x1f:
      if (cVar9 == -8) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x40;
        value_01 = local_38;
        goto LAB_002ff61b;
      }
      break;
    case 0x24:
      if (cVar9 == '\"') {
        psVar8 = mutable_objc_class_prefix_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->objc_class_prefix_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.objc_class_prefix");
        goto LAB_002ff27c;
      }
      break;
    case 0x25:
      if (cVar9 == '*') {
        psVar8 = mutable_csharp_namespace_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->csharp_namespace_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.csharp_namespace");
        goto LAB_002ff27c;
      }
      break;
    case 0x27:
      if (cVar9 == ':') {
        psVar8 = mutable_swift_prefix_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->swift_prefix_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.swift_prefix");
        goto LAB_002ff27c;
      }
      break;
    case 0x28:
      if (cVar9 == 'B') {
        psVar8 = mutable_php_class_prefix_abi_cxx11_(this);
        bVar5 = internal::WireFormatLite::ReadBytes(input,psVar8);
        if (!bVar5) {
          return false;
        }
        psVar8 = (this->php_class_prefix_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar8->_M_dataplus)._M_p,(int)psVar8->_M_string_length,PARSE,
                   "google.protobuf.FileOptions.php_class_prefix");
        goto LAB_002ff27c;
      }
      break;
    default:
      if ((uVar4 == 999) && (cVar9 == ':')) {
        value_00 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add(local_78);
        bVar5 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(input,value_00);
        goto LAB_002ff620;
      }
    }
switchD_002ff333_caseD_2:
    if (uVar10 == 0) {
      return true;
    }
    if ((uVar10 & 7) == 4) {
      return true;
    }
    pUVar7 = mutable_unknown_fields(this);
    if (uVar10 < 8000) {
      bVar5 = internal::WireFormat::SkipField(input,uVar10,pUVar7);
    }
    else {
      bVar5 = internal::ExtensionSet::ParseField
                        (&this->_extensions_,uVar10,input,(Message *)&_FileOptions_default_instance_
                         ,pUVar7);
    }
LAB_002ff620:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_outer_classname");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_java_multiple_files();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.go_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(128u)) {
          set_has_cc_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(136u)) {
          set_has_java_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(144u)) {
          set_has_py_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {
          set_has_java_generate_equals_and_hash();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 23 [default = false];
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(184u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(216u)) {
          set_has_java_string_check_utf8();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_string_check_utf8_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_enable_arenas = 31 [default = false];
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {
          set_has_cc_enable_arenas();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_enable_arenas_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string objc_class_prefix = 36;
      case 36: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(290u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_objc_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->objc_class_prefix().data(), this->objc_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.objc_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string csharp_namespace = 37;
      case 37: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(298u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_csharp_namespace()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->csharp_namespace().data(), this->csharp_namespace().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.csharp_namespace");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string swift_prefix = 39;
      case 39: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(314u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_swift_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->swift_prefix().data(), this->swift_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.swift_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string php_class_prefix = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_php_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->php_class_prefix().data(), this->php_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.php_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileOptions)
  return false;
#undef DO_
}